

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMRegressor.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::GLMRegressor_DoubleArray::GLMRegressor_DoubleArray
          (GLMRegressor_DoubleArray *this,Arena *arena,bool is_message_owned)

{
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite,arena,is_message_owned);
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__GLMRegressor_DoubleArray_00405e50;
  (this->value_).current_size_ = 0;
  (this->value_).total_size_ = 0;
  (this->value_).arena_or_elements_ = arena;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  return;
}

Assistant:

GLMRegressor_DoubleArray::GLMRegressor_DoubleArray(::PROTOBUF_NAMESPACE_ID::Arena* arena,
                         bool is_message_owned)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(arena, is_message_owned),
  value_(arena) {
  SharedCtor();
  if (!is_message_owned) {
    RegisterArenaDtor(arena);
  }
  // @@protoc_insertion_point(arena_constructor:CoreML.Specification.GLMRegressor.DoubleArray)
}